

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

void __thiscall
btAlignedObjectArray<btMultiBody_*>::swap
          (btAlignedObjectArray<btMultiBody_*> *this,int index0,int index1)

{
  btMultiBody *pbVar1;
  btMultiBody *temp;
  int index1_local;
  int index0_local;
  btAlignedObjectArray<btMultiBody_*> *this_local;
  
  pbVar1 = this->m_data[index0];
  this->m_data[index0] = this->m_data[index1];
  this->m_data[index1] = pbVar1;
  return;
}

Assistant:

void	swap(int index0,int index1)
		{
#ifdef BT_USE_MEMCPY
			char	temp[sizeof(T)];
			memcpy(temp,&m_data[index0],sizeof(T));
			memcpy(&m_data[index0],&m_data[index1],sizeof(T));
			memcpy(&m_data[index1],temp,sizeof(T));
#else
			T temp = m_data[index0];
			m_data[index0] = m_data[index1];
			m_data[index1] = temp;
#endif //BT_USE_PLACEMENT_NEW

		}